

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

int Cba_NtkInsertGiaLit(Cba_Ntk_t *p,int iLit,Vec_Int_t *vLit2Fon,int fUseXor)

{
  int *piVar1;
  uint i;
  int iVar2;
  int k;
  uint uVar3;
  
  if ((uint)iLit < 2) {
    return ~iLit;
  }
  if ((-1 < iLit) && (iLit < vLit2Fon->nSize)) {
    iVar2 = vLit2Fon->pArray[(uint)iLit];
    if (-1 < iVar2) {
      return iVar2;
    }
    if ((iLit & 1U) == 0) {
      __assert_fail("Abc_LitIsCompl(iLit)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                    ,0x3f0,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
    }
    uVar3 = iLit & 0x7ffffffe;
    if ((int)uVar3 < vLit2Fon->nSize) {
      if (vLit2Fon->pArray[uVar3] < 0) {
        __assert_fail("Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                      ,0x3f1,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
      }
      if (fUseXor == 0) {
        i = Cba_ObjAlloc(p,CBA_BOX_INV,1,1);
        if (vLit2Fon->nSize <= (int)uVar3) goto LAB_003d9b28;
        iVar2 = vLit2Fon->pArray[uVar3];
        k = 0;
      }
      else {
        i = Cba_ObjAlloc(p,CBA_BOX_XOR,2,1);
        if (vLit2Fon->nSize <= (int)uVar3) goto LAB_003d9b28;
        Cba_ObjSetFinFon(p,i,0,vLit2Fon->pArray[uVar3]);
        k = 1;
        iVar2 = -2;
      }
      Cba_ObjSetFinFon(p,i,k,iVar2);
      if ((int)i < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((int)i < (p->vObjFon0).nSize) {
        if (vLit2Fon->nSize <= iLit) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (p->vObjFon0).pArray;
        vLit2Fon->pArray[(uint)iLit] = piVar1[i];
        if ((int)i < (p->vObjFon0).nSize) {
          return piVar1[i];
        }
      }
    }
  }
LAB_003d9b28:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Cba_NtkInsertGiaLit( Cba_Ntk_t * p, int iLit, Vec_Int_t * vLit2Fon, int fUseXor )
{
    int iObjNew;
    if ( iLit == 0 || iLit == 1 )
        return Cba_FonFromConst(iLit);
    if ( Vec_IntEntry(vLit2Fon, iLit) >= 0 )
        return Vec_IntEntry(vLit2Fon, iLit);
    assert( Abc_LitIsCompl(iLit) );
    assert( Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0 );
    // create inverter
    if ( fUseXor )
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_XOR, 2, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
        Cba_ObjSetFinFon( p, iObjNew, 1, Cba_FonFromConst(1) );
    }
    else
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_INV, 1, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
    }
    // save the result
    Vec_IntWriteEntry( vLit2Fon, iLit, Cba_ObjFon0(p, iObjNew) );
    return Cba_ObjFon0(p, iObjNew);
}